

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_0::DatagramPortImpl::send
          (DatagramPortImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  char *pcVar1;
  bool bVar2;
  int osErrorNumber;
  NetworkAddressImpl *this_00;
  unsigned_long *puVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  ArrayPtr<const_unsigned_char> *pAVar7;
  uchar *puVar8;
  uchar *__src;
  iovec *piVar9;
  void *pvVar10;
  undefined4 in_register_00000084;
  ArrayPtr<iovec> AVar11;
  Range<unsigned_long> RVar12;
  undefined1 local_288 [16];
  Fault f;
  SyscallResult local_25c;
  undefined1 auStack_258 [4];
  SyscallResult _kjSyscallResult;
  ssize_t n;
  size_t i_2;
  char *local_230;
  size_t i_1;
  size_t extraSize;
  Array<unsigned_char> extra;
  size_t i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_long> *__range2;
  undefined1 local_1c0 [8];
  ArrayPtr<iovec> iov;
  Array<iovec> iov_heap;
  iovec iov_stack [16];
  size_t sStack_90;
  bool iov_isOnStack;
  size_t local_88;
  size_t iov_size;
  size_t iovmax;
  SocketAddress *local_70;
  SocketAddress *addr;
  msghdr msg;
  NetworkAddress *destination_local;
  DatagramPortImpl *this_local;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces_local;
  
  msg._52_4_ = in_register_00000084;
  msg.msg_flags = __flags;
  this_local = (DatagramPortImpl *)__buf;
  pieces_local.ptr = (ArrayPtr<const_unsigned_char> *)__n;
  pieces_local.size_ = (size_t)this;
  memset(&addr,0,0x38);
  this_00 = downcast<kj::(anonymous_namespace)::NetworkAddressImpl,kj::NetworkAddress>
                      ((NetworkAddress *)msg._48_8_);
  local_70 = NetworkAddressImpl::chooseOneAddress(this_00);
  iovmax = (size_t)SocketAddress::getRaw(local_70);
  addr = (SocketAddress *)implicitCast<void_const*,sockaddr_const*>((sockaddr **)&iovmax);
  msg.msg_name._0_4_ = SocketAddress::getRawSize(local_70);
  iov_size = 0x400;
  sStack_90 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                        ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
  local_88 = min<unsigned_long,unsigned_long_const&>(&stack0xffffffffffffff70,&iov_size);
  if (local_88 < 0x11) {
    Array<iovec>::Array((Array<iovec> *)&iov.size_,(void *)0x0);
    AVar11 = arrayPtr<iovec>((iovec *)&iov_heap.disposer,local_88);
  }
  else {
    heapArray<iovec>((Array<iovec> *)&iov.size_,local_88);
    AVar11 = kj::Array::operator_cast_to_ArrayPtr((Array *)&iov.size_);
  }
  iov.ptr = (iovec *)AVar11.size_;
  local_1c0 = (undefined1  [8])AVar11.ptr;
  RVar12 = indices<kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>&>
                     ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
  __begin2.value = RVar12.begin_;
  __end2 = Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin2);
  i = (size_t)Range<unsigned_long>::end((Range<unsigned_long> *)&__begin2);
  while (bVar2 = Range<unsigned_long>::Iterator::operator==(&__end2,(Iterator *)&i),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    puVar3 = Range<unsigned_long>::Iterator::operator*(&__end2);
    sVar5 = *puVar3;
    pAVar7 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::operator[]
                       ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,sVar5);
    extra.disposer = (ArrayDisposer *)ArrayPtr<const_unsigned_char>::begin(pAVar7);
    pvVar10 = implicitCast<void_const*,unsigned_char_const*>((uchar **)&extra.disposer);
    piVar9 = ArrayPtr<iovec>::operator[]((ArrayPtr<iovec> *)local_1c0,sVar5);
    piVar9->iov_base = pvVar10;
    pAVar7 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::operator[]
                       ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,sVar5);
    sVar4 = ArrayPtr<const_unsigned_char>::size(pAVar7);
    piVar9 = ArrayPtr<iovec>::operator[]((ArrayPtr<iovec> *)local_1c0,sVar5);
    piVar9->iov_len = sVar4;
    Range<unsigned_long>::Iterator::operator++(&__end2);
  }
  Array<unsigned_char>::Array((Array<unsigned_char> *)&extraSize);
  sVar5 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
  if (0x400 < sVar5) {
    i_1 = 0;
    for (local_230 = (char *)0x3ff; pcVar1 = local_230,
        pcVar6 = (char *)ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                                   ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)
                                    &this_local), pcVar1 < pcVar6; local_230 = local_230 + 1) {
      pAVar7 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,
                          (size_t)local_230);
      sVar5 = ArrayPtr<const_unsigned_char>::size(pAVar7);
      i_1 = sVar5 + i_1;
    }
    heapArray<unsigned_char>((Array<unsigned_char> *)&i_2,i_1);
    Array<unsigned_char>::operator=((Array<unsigned_char> *)&extraSize,(Array<unsigned_char> *)&i_2)
    ;
    Array<unsigned_char>::~Array((Array<unsigned_char> *)&i_2);
    i_1 = 0;
    for (n = 0x3ff;
        sVar5 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                          ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local),
        (ulong)n < sVar5; n = n + 1) {
      puVar8 = Array<unsigned_char>::begin((Array<unsigned_char> *)&extraSize);
      puVar8 = puVar8 + i_1;
      pAVar7 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,n);
      __src = ArrayPtr<const_unsigned_char>::begin(pAVar7);
      pAVar7 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,n);
      sVar5 = ArrayPtr<const_unsigned_char>::size(pAVar7);
      memcpy(puVar8,__src,sVar5);
      pAVar7 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,n);
      sVar5 = ArrayPtr<const_unsigned_char>::size(pAVar7);
      i_1 = sVar5 + i_1;
    }
    puVar8 = Array<unsigned_char>::begin((Array<unsigned_char> *)&extraSize);
    piVar9 = ArrayPtr<iovec>::back((ArrayPtr<iovec> *)local_1c0);
    piVar9->iov_base = puVar8;
    sVar5 = Array<unsigned_char>::size((Array<unsigned_char> *)&extraSize);
    piVar9 = ArrayPtr<iovec>::back((ArrayPtr<iovec> *)local_1c0);
    piVar9->iov_len = sVar5;
  }
  msg._8_8_ = ArrayPtr<iovec>::begin((ArrayPtr<iovec> *)local_1c0);
  msg.msg_iov = (iovec *)ArrayPtr<iovec>::size((ArrayPtr<iovec> *)local_1c0);
  f.exception = (Exception *)auStack_258;
  local_25c = kj::_::Debug::
              syscall<kj::(anonymous_namespace)::DatagramPortImpl::send(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>,kj::NetworkAddress&)::__0>
                        ((anon_class_24_3_c5cf561a *)&f,true);
  pvVar10 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_25c);
  if (pvVar10 == (void *)0x0) {
    osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_25c);
    kj::_::Debug::Fault::Fault
              ((Fault *)(local_288 + 8),
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x721,osErrorNumber,"n = sendmsg(fd, &msg, 0)","");
    kj::_::Debug::Fault::fatal((Fault *)(local_288 + 8));
  }
  if ((long)_auStack_258 < 0) {
    UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_288);
    Promise<void>::
    then<kj::(anonymous_namespace)::DatagramPortImpl::send(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>,kj::NetworkAddress&)::__1>
              ((Promise<void> *)this,(Type *)local_288);
    Promise<void>::~Promise((Promise<void> *)local_288);
  }
  else {
    Promise<unsigned_long>::Promise
              ((Promise<unsigned_long> *)this,(FixVoid<unsigned_long>)_auStack_258);
  }
  Array<unsigned_char>::~Array((Array<unsigned_char> *)&extraSize);
  Array<iovec>::~Array((Array<iovec> *)&iov.size_);
  return (ssize_t)this;
}

Assistant:

Promise<size_t> DatagramPortImpl::send(
    ArrayPtr<const ArrayPtr<const byte>> pieces, NetworkAddress& destination) {
  struct msghdr msg;
  memset(&msg, 0, sizeof(msg));

  auto& addr = downcast<NetworkAddressImpl>(destination).chooseOneAddress();
  msg.msg_name = const_cast<void*>(implicitCast<const void*>(addr.getRaw()));
  msg.msg_namelen = addr.getRawSize();

  const size_t iovmax = kj::miniposix::iovMax();
  KJ_STACK_ARRAY(struct iovec, iov, kj::min(pieces.size(), iovmax), 16, 64);

  for (size_t i: kj::indices(pieces)) {
    iov[i].iov_base = const_cast<void*>(implicitCast<const void*>(pieces[i].begin()));
    iov[i].iov_len = pieces[i].size();
  }

  Array<byte> extra;
  if (pieces.size() > iovmax) {
    // Too many pieces, but we can't use multiple syscalls because they'd send separate
    // datagrams. We'll have to copy the trailing pieces into a temporary array.
    //
    // TODO(perf): On Linux we could use multiple syscalls via MSG_MORE or sendmsg/sendmmsg.
    size_t extraSize = 0;
    for (size_t i = iovmax - 1; i < pieces.size(); i++) {
      extraSize += pieces[i].size();
    }
    extra = kj::heapArray<byte>(extraSize);
    extraSize = 0;
    for (size_t i = iovmax - 1; i < pieces.size(); i++) {
      memcpy(extra.begin() + extraSize, pieces[i].begin(), pieces[i].size());
      extraSize += pieces[i].size();
    }
    iov.back().iov_base = extra.begin();
    iov.back().iov_len = extra.size();
  }

  msg.msg_iov = iov.begin();
  msg.msg_iovlen = iov.size();

  ssize_t n;
  KJ_NONBLOCKING_SYSCALL(n = sendmsg(fd, &msg, 0));
  if (n < 0) {
    // Write buffer full.
    return observer.whenBecomesWritable().then([this, pieces, &destination]() {
      return send(pieces, destination);
    });
  } else {
    // If less than the whole message was sent, then it was truncated, and there's nothing we can
    // do about that now.
    return n;
  }
}